

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Capturer::captureValue(Capturer *this,size_t index,string *value)

{
  IResultCapture *pIVar1;
  size_type sVar2;
  reference pvVar3;
  string *value_local;
  size_t index_local;
  Capturer *this_local;
  
  sVar2 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                    (&this->m_messages);
  if (index < sVar2) {
    pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::operator[]
                       (&this->m_messages,index);
    std::__cxx11::string::operator+=((string *)&pvVar3->message,(string *)value);
    pIVar1 = this->m_resultCapture;
    pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::operator[]
                       (&this->m_messages,index);
    (*pIVar1->_vptr_IResultCapture[6])(pIVar1,pvVar3);
    this->m_captured = this->m_captured + 1;
    return;
  }
  __assert_fail("index < m_messages.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/tests/catch.hpp"
                ,0x2e9c,"void Catch::Capturer::captureValue(size_t, const std::string &)");
}

Assistant:

void Capturer::captureValue( size_t index, std::string const& value ) {
        assert( index < m_messages.size() );
        m_messages[index].message += value;
        m_resultCapture.pushScopedMessage( m_messages[index] );
        m_captured++;
    }